

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

void drawTriangle(ImVec2 p0,ImVec2 p1,ImVec2 p2,uchar col,TScreen *screen)

{
  int iVar1;
  int iVar2;
  value_type vVar3;
  float *pfVar4;
  size_type sVar5;
  reference pvVar6;
  uint *puVar7;
  TScreen *in_RSI;
  byte in_DIL;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  uint in_XMM1_Db;
  vector<int,_std::allocator<int>_> *in_XMM2_Qa;
  int unaff_retaddr;
  int unaff_retaddr_00;
  TCell *cell;
  int len;
  int x;
  int y_1;
  int y;
  int ydelta;
  int ymax;
  int ymin;
  int local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar8;
  float local_38;
  int local_34;
  float local_30;
  int local_2c;
  TScreen *local_28;
  byte local_19;
  long lVar9;
  float ymax_00;
  undefined8 uVar10;
  
  uVar10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  lVar9 = (ulong)in_XMM1_Db << 0x20;
  local_28 = in_RSI;
  local_19 = in_DIL;
  iVar2 = ImTui::TScreen::size(in_RSI);
  local_30 = (float)iVar2;
  pfVar4 = std::min<float>(&local_30,(float *)&stack0xfffffffffffffffc);
  pfVar4 = std::min<float>(pfVar4,(float *)&stack0xfffffffffffffff4);
  pfVar4 = std::min<float>(pfVar4,(float *)&stack0xffffffffffffffec);
  local_2c = (int)*pfVar4;
  local_38 = 0.0;
  pfVar4 = std::max<float>(&local_38,(float *)&stack0xfffffffffffffffc);
  pfVar4 = std::max<float>(pfVar4,(float *)&stack0xfffffffffffffff4);
  pfVar4 = std::max<float>(pfVar4,(float *)&stack0xffffffffffffffec);
  local_34 = (int)*pfVar4;
  iVar2 = (local_34 - local_2c) + 1;
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&g_xrange);
  if (SBORROW4((int)sVar5,iVar2 * 2) != (int)sVar5 + iVar2 * -2 < 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  for (iVar8 = 0; ymax_00 = (float)((ulong)lVar9 >> 0x20), iVar8 < iVar2; iVar8 = iVar8 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 << 1));
    *pvVar6 = 999999;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 * 2 + 1));
    *pvVar6 = -999999;
  }
  ScanLine(unaff_retaddr_00,unaff_retaddr,(int)(float)((ulong)uVar10 >> 0x20),(int)uVar10,
           (int)ymax_00,in_XMM2_Qa);
  ScanLine(unaff_retaddr_00,unaff_retaddr,(int)(float)((ulong)uVar10 >> 0x20),(int)uVar10,
           (int)ymax_00,in_XMM2_Qa);
  ScanLine(unaff_retaddr_00,unaff_retaddr,(int)(float)((ulong)uVar10 >> 0x20),(int)uVar10,
           (int)ymax_00,in_XMM2_Qa);
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 * 2 + 1));
    iVar1 = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 << 1));
    if (*pvVar6 <= iVar1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 << 1));
      vVar3 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 * 2 + 1));
      iVar1 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&g_xrange,(long)(iVar8 << 1));
      local_4c = (iVar1 + 1) - *pvVar6;
      while (local_4c != 0) {
        if ((((-1 < vVar3) && (vVar3 < local_28->nx)) && (-1 < iVar8 + local_2c)) &&
           (iVar8 + local_2c < local_28->ny)) {
          puVar7 = local_28->data + ((iVar8 + local_2c) * local_28->nx + vVar3);
          *puVar7 = *puVar7 & 0xff0000;
          *puVar7 = *puVar7 | 0x20;
          *puVar7 = (uint)local_19 << 0x18 | *puVar7;
        }
        vVar3 = vVar3 + 1;
        local_4c = local_4c + -1;
      }
    }
  }
  return;
}

Assistant:

void drawTriangle(ImVec2 p0, ImVec2 p1, ImVec2 p2, unsigned char col, ImTui::TScreen * screen) {
    int ymin = std::min(std::min(std::min((float) screen->size(), p0.y), p1.y), p2.y);
    int ymax = std::max(std::max(std::max(0.0f, p0.y), p1.y), p2.y);

    int ydelta = ymax - ymin + 1;

    if ((int) g_xrange.size() < 2*ydelta) {
        g_xrange.resize(2*ydelta);
    }

    for (int y = 0; y < ydelta; y++) {
        g_xrange[2*y+0] = 999999;
        g_xrange[2*y+1] = -999999;
    }

    ScanLine(p0.x, p0.y - ymin, p1.x, p1.y - ymin, ydelta, g_xrange);
    ScanLine(p1.x, p1.y - ymin, p2.x, p2.y - ymin, ydelta, g_xrange);
    ScanLine(p2.x, p2.y - ymin, p0.x, p0.y - ymin, ydelta, g_xrange);

    for (int y = 0; y < ydelta; y++) {
        if (g_xrange[2*y+1] >= g_xrange[2*y+0]) {
            int x = g_xrange[2*y+0];
            int len = 1 + g_xrange[2*y+1] - g_xrange[2*y+0];

            while (len--) {
                if (x >= 0 && x < screen->nx && y + ymin >= 0 && y + ymin < screen->ny) {
                    auto & cell = screen->data[(y + ymin)*screen->nx + x];
                    cell &= 0x00FF0000;
                    cell |= ' ';
                    cell |= ((ImTui::TCell)(col) << 24);
                }
                ++x;
            }
        }
    }
}